

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_delete_channel(cali_id_t chn_id)

{
  ostream *poVar1;
  Channel channel;
  Caliper c;
  undefined1 local_250 [48];
  Log local_220;
  
  cali::Caliper::Caliper((Caliper *)(local_250 + 0x10));
  cali::Caliper::get_channel((Caliper *)local_250,(cali_id_t)(local_250 + 0x10));
  if (((GlobalData *)local_250._8_8_ == (GlobalData *)0x0) ||
     (*(_Atomic_word *)(local_250._8_8_ + 8) < 1)) {
    std::ofstream::ofstream(&local_220);
    local_220.m_level = 0;
    poVar1 = cali::Log::stream(&local_220);
    poVar1 = std::operator<<(poVar1,"cali_channel_delete(): invalid channel id ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ofstream::~ofstream(&local_220);
  }
  else {
    cali::Caliper::delete_channel((Caliper *)(local_250 + 0x10),(Channel *)local_250);
  }
  cali::Channel::~Channel((Channel *)local_250);
  return;
}

Assistant:

void cali_delete_channel(cali_id_t chn_id)
{
    Caliper c;
    Channel channel = c.get_channel(chn_id);

    if (channel)
        c.delete_channel(channel);
    else
        Log(0).stream() << "cali_channel_delete(): invalid channel id " << chn_id << std::endl;
}